

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O1

Status __thiscall
flatbuffers::anon_unknown_25::LuaBfbsGenerator::GenerateFromSchema
          (LuaBfbsGenerator *this,Schema *schema,CodeGenOptions *options)

{
  ushort uVar1;
  long lVar2;
  undefined8 uVar3;
  unsigned_short vtsize;
  uint8_t *offset_location;
  Schema *pSVar4;
  uint8_t *offset_location_1;
  Schema *pSVar5;
  LuaBfbsGenerator *local_68;
  Schema **ppSStack_60;
  code *local_58;
  code *pcStack_50;
  Schema *local_48;
  LuaBfbsGenerator *local_40;
  Schema *local_38;
  
  std::__cxx11::string::_M_assign((string *)&this->options_);
  if (*(ushort *)(schema + -(long)*(int *)schema) < 7) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(schema + (6 - (long)*(int *)schema));
  }
  if (uVar1 == 0) {
    pSVar5 = (Schema *)0x0;
  }
  else {
    pSVar5 = schema + (ulong)*(uint *)(schema + uVar1) + (ulong)uVar1;
  }
  ppSStack_60 = (Schema **)0x0;
  pcStack_50 = std::
               _Function_handler<void_(const_reflection::Enum_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/bfbs_gen_lua.cpp:142:24)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(const_reflection::Enum_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/bfbs_gen_lua.cpp:142:24)>
             ::_M_manager;
  local_68 = this;
  local_40 = this;
  if ((*(uint *)pSVar5 & 0x3fffffff) != 0) {
    pSVar4 = pSVar5 + 4;
    do {
      local_48 = pSVar4 + *(uint *)pSVar4;
      if (local_58 == (code *)0x0) {
        std::__throw_bad_function_call();
        goto LAB_00325f71;
      }
      (*pcStack_50)(&local_68,&local_48);
      pSVar4 = pSVar4 + 4;
    } while (pSVar4 != pSVar5 + 4 + (*(uint *)pSVar5 << 2));
  }
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  lVar2 = -(long)*(int *)schema;
  if (*(ushort *)(schema + -(long)*(int *)schema) < 5) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(schema + lVar2 + 4);
  }
  if (uVar1 == 0) {
    pSVar5 = (Schema *)0x0;
  }
  else {
    pSVar5 = schema + (ulong)*(uint *)(schema + uVar1) + (ulong)uVar1;
  }
  if (*(ushort *)(schema + -(long)*(int *)schema) < 0xd) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(schema + lVar2 + 0xc);
  }
  if (uVar1 == 0) {
    local_38 = (Schema *)0x0;
  }
  else {
    local_38 = schema + (ulong)*(uint *)(schema + uVar1) + (ulong)uVar1;
  }
  ppSStack_60 = &local_38;
  local_68 = local_40;
  pcStack_50 = std::
               _Function_handler<void_(const_reflection::Object_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/bfbs_gen_lua.cpp:170:28)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(const_reflection::Object_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/bfbs_gen_lua.cpp:170:28)>
             ::_M_manager;
  if ((*(uint *)pSVar5 & 0x3fffffff) != 0) {
    pSVar4 = pSVar5 + 4;
    do {
      local_48 = pSVar4 + *(uint *)pSVar4;
      if (local_58 == (code *)0x0) {
LAB_00325f71:
        uVar3 = std::__throw_bad_function_call();
        __clang_call_terminate(uVar3);
      }
      (*pcStack_50)(&local_68,&local_48);
      pSVar4 = pSVar4 + 4;
    } while (pSVar4 != pSVar5 + 4 + (*(uint *)pSVar5 << 2));
  }
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  return OK;
}

Assistant:

Status GenerateFromSchema(const r::Schema *schema,
                            const CodeGenOptions &options)
      FLATBUFFERS_OVERRIDE {
    options_ = options;
    if (!GenerateEnums(schema->enums())) { return ERROR; }
    if (!GenerateObjects(schema->objects(), schema->root_table())) {
      return ERROR;
    }
    return OK;
  }